

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::Unhide(Character *this,int unsetflags)

{
  bool bVar1;
  int num;
  list<Character_*,_std::allocator<Character_*>_> *this_00;
  reference ppCVar2;
  Character *character;
  iterator __end2;
  iterator __begin2;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  undefined1 local_48 [8];
  PacketBuilder builder;
  bool washidden;
  int unsetflags_local;
  Character *this_local;
  
  builder.add_size._3_1_ = (this->hidden & 1U) != 0;
  this->hidden = (unsetflags ^ 0xffffffffU) & this->hidden;
  if (((bool)builder.add_size._3_1_) && ((unsetflags & 1U) != 0)) {
    builder.add_size._4_4_ = unsetflags;
    PacketBuilder::PacketBuilder((PacketBuilder *)local_48,PACKET_ADMININTERACT,PACKET_AGREE,2);
    num = PlayerID(this);
    PacketBuilder::AddShort((PacketBuilder *)local_48,num);
    this_00 = &this->map->characters;
    __end2 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_00);
    character = (Character *)
                std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_00);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&character);
      if (!bVar1) break;
      ppCVar2 = std::_List_iterator<Character_*>::operator*(&__end2);
      Send(*ppCVar2,(PacketBuilder *)local_48);
      std::_List_iterator<Character_*>::operator++(&__end2);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_48);
  }
  return;
}

Assistant:

void Character::Unhide(int unsetflags)
{
	bool washidden = this->hidden & HideInvisible;
	this->hidden &= ~unsetflags;

	if (washidden && (unsetflags & HideInvisible))
	{
		PacketBuilder builder(PACKET_ADMININTERACT, PACKET_AGREE, 2);
		builder.AddShort(this->PlayerID());

		UTIL_FOREACH(this->map->characters, character)
		{
			character->Send(builder);
		}
	}
}